

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::AsyncStreamFd::pumpFromFile
          (AsyncStreamFd *this,FileInputStream *input,int fileFd,uint64_t amount,uint64_t soFar)

{
  undefined4 in_register_00000014;
  off_t in_R9;
  Fault local_d8;
  Fault f;
  undefined1 local_98 [20];
  int error;
  FileInputStream *local_80;
  Disposer *local_78;
  PromiseFulfiller<void> *local_70;
  Disposer *local_68;
  uint local_60;
  uint local_5c;
  int _kjSyscallError;
  Disposer local_50;
  size_t requested;
  ssize_t n;
  off_t offset;
  uint64_t soFar_local;
  uint64_t amount_local;
  FileInputStream *pFStack_20;
  int fileFd_local;
  FileInputStream *input_local;
  AsyncStreamFd *this_local;
  
  pFStack_20 = (FileInputStream *)CONCAT44(in_register_00000014,fileFd);
  amount_local._4_4_ = (undefined4)amount;
  soFar_local = soFar;
  input_local = input;
  this_local = this;
  for (offset = in_R9; (ulong)offset < soFar_local; offset = requested + offset) {
    n = FileInputStream::getOffset(pFStack_20);
    __kjSyscallError = (Disposer *)(soFar_local - offset);
    local_5c = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&kj::maxValue);
    local_50._vptr_Disposer =
         (_func_int **)min<unsigned_long,unsigned_int>((unsigned_long *)&_kjSyscallError,&local_5c);
    unique0x00004780 = (Disposer *)&requested;
    local_78 = (Disposer *)((long)&amount_local + 4);
    local_70 = (PromiseFulfiller<void> *)&n;
    local_68 = &local_50;
    local_80 = input;
    local_98._12_4_ =
         kj::_::Debug::
         syscallError<kj::(anonymous_namespace)::AsyncStreamFd::pumpFromFile(kj::FileInputStream&,int,unsigned_long,unsigned_long)::_lambda()_1_>
                   ((anon_class_40_5_dbe8fbd5 *)(local_98 + 0x10),false);
    local_60 = local_98._12_4_;
    if (local_98._12_4_ != 0) {
      if (local_98._12_4_ == 0xb) {
        UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_98);
        Promise<void>::
        then<kj::(anonymous_namespace)::AsyncStreamFd::pumpFromFile(kj::FileInputStream&,int,unsigned_long,unsigned_long)::_lambda()_2_>
                  ((Promise<void> *)this,(Type *)local_98);
        Promise<void>::~Promise((Promise<void> *)local_98);
        return (PromiseBase)(PromiseBase)this;
      }
      if ((local_98._12_4_ != 0x16) && (local_98._12_4_ != 0x26)) {
        kj::_::Debug::Fault::Fault
                  (&local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x122,local_98._12_4_,"sendfile","");
        kj::_::Debug::Fault::fatal(&local_d8);
      }
      unoptimizedPumpTo((kj *)this,&pFStack_20->super_AsyncInputStream,
                        (AsyncOutputStream *)&input->file,soFar_local,offset);
      return (PromiseBase)(PromiseBase)this;
    }
    if (requested == 0) break;
    FileInputStream::seek(pFStack_20,n);
  }
  Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,offset);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> pumpFromFile(FileInputStream& input, int fileFd,
                                 uint64_t amount, uint64_t soFar) {
    while (soFar < amount) {
      off_t offset = input.getOffset();
      ssize_t n;

      // Although sendfile()'s last argument has type size_t, on Linux it seems to cause EINVAL
      // if we pass an amount that is greater than UINT32_MAX, so make sure to clamp to that. In
      // practice, of course, we'll be limited to the socket buffer size.
      size_t requested = kj::min(amount - soFar, (uint32_t)kj::maxValue);

      KJ_SYSCALL_HANDLE_ERRORS(n = sendfile(fd, fileFd, &offset, requested)) {
        case EINVAL:
        case ENOSYS:
          // Fall back to regular pump
          return unoptimizedPumpTo(input, *this, amount, soFar);

        case EAGAIN:
          return observer.whenBecomesWritable()
              .then([this, &input, fileFd, amount, soFar]() {
            return pumpFromFile(input, fileFd, amount, soFar);
          });

        default:
          KJ_FAIL_SYSCALL("sendfile", error);
      }

      if (n == 0) break;

      input.seek(offset);  // NOTE: sendfile() updated `offset` in-place.
      soFar += n;
    }

    return soFar;
  }